

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O2

_Bool parse_paint(element_t *element,int id,paint_t *paint)

{
  byte bVar1;
  _Bool _Var2;
  string_t *psVar3;
  size_t sVar4;
  string_t *end;
  string_t *local_28;
  string_t *local_20;
  
  psVar3 = find_attribute(element,id,true);
  if (psVar3 == (string_t *)0x0) goto LAB_00106c69;
  local_28 = (string_t *)psVar3->data;
  end = (string_t *)((long)&local_28->data + psVar3->length);
  _Var2 = skip_string((char **)&local_28,(char *)end,"none");
  if (_Var2) {
    paint->type = paint_type_none;
  }
  else {
    local_20 = local_28;
    _Var2 = skip_string((char **)&local_20,(char *)end,"url");
    if ((((_Var2) && (_Var2 = skip_ws((char **)&local_20,(char *)end), _Var2)) && (local_20 < end))
       && (*(char *)&local_20->data == '(')) {
      local_20 = (string_t *)((long)&local_20->data + 1);
      _Var2 = skip_ws((char **)&local_20,(char *)end);
      if (((_Var2) && (local_20 < end)) && (*(char *)&local_20->data == '#')) {
        (paint->id).data = (char *)((long)&local_20->data + 1);
        (paint->id).length = 0;
        for (sVar4 = 1; psVar3 = (string_t *)((long)&local_20->data + sVar4), psVar3 < end;
            sVar4 = sVar4 + 1) {
          if (*(char *)&psVar3->data == ')') {
            local_28 = (string_t *)((long)&local_20->data + sVar4 + 1);
            skip_ws((char **)&local_28,(char *)end);
            paint->type = paint_type_url;
            (paint->color).value = 0;
            _Var2 = skip_ws((char **)&local_28,(char *)end);
            psVar3 = (string_t *)(ulong)_Var2;
            if (_Var2) {
              _Var2 = parse_color_value((char **)&local_28,(char *)end,&paint->color);
              psVar3 = (string_t *)(ulong)_Var2;
            }
            goto LAB_00106c69;
          }
          (paint->id).length = sVar4;
        }
      }
    }
    _Var2 = skip_string((char **)&local_28,(char *)end,"var");
    if (!_Var2) {
      _Var2 = parse_color_value((char **)&local_28,(char *)end,&paint->color);
      psVar3 = (string_t *)(ulong)_Var2;
      if (_Var2) {
        paint->type = paint_type_color;
      }
      goto LAB_00106c69;
    }
    _Var2 = skip_ws((char **)&local_28,(char *)end);
    psVar3 = (string_t *)(ulong)_Var2;
    if (((!_Var2) || (psVar3 = local_28, end <= local_28)) || (*(char *)&local_28->data != '('))
    goto LAB_00106c69;
    local_28 = (string_t *)((long)&local_28->data + 1);
    _Var2 = skip_ws((char **)&local_28,(char *)end);
    psVar3 = (string_t *)(ulong)_Var2;
    if (!_Var2) goto LAB_00106c69;
    _Var2 = skip_string((char **)&local_28,(char *)end,"--");
    psVar3 = (string_t *)(ulong)_Var2;
    if (!_Var2) goto LAB_00106c69;
    sVar4 = 0;
    while ((psVar3 = (string_t *)((long)&local_28->data + sVar4), psVar3 < end &&
           ((((bVar1 = *(byte *)&psVar3->data, (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a ||
              (bVar1 == 0x3a)) || (bVar1 == 0x5f)) ||
            ((byte)(bVar1 - 0x30) < 10 || (byte)(bVar1 - 0x2d) < 2))))) {
      sVar4 = sVar4 + 1;
    }
    paint->type = paint_type_var;
    (paint->id).data = (char *)local_28;
    (paint->id).length = sVar4;
    (paint->color).value = 0;
    local_28 = psVar3;
    skip_ws((char **)&local_28,(char *)end);
    if ((local_28 < end) && (*(char *)&local_28->data == ',')) {
      local_28 = (string_t *)((long)&local_28->data + 1);
      skip_ws((char **)&local_28,(char *)end);
      _Var2 = parse_color_value((char **)&local_28,(char *)end,&paint->color);
      psVar3 = (string_t *)(ulong)_Var2;
      if (!_Var2) goto LAB_00106c69;
    }
    psVar3 = local_28;
    if ((end <= local_28) || (*(char *)&local_28->data != ')')) goto LAB_00106c69;
    local_28 = (string_t *)((long)&local_28->data + 1);
  }
  _Var2 = skip_ws((char **)&local_28,(char *)end);
  psVar3 = (string_t *)(ulong)_Var2;
LAB_00106c69:
  return SUB81(psVar3,0);
}

Assistant:

static bool parse_paint(const element_t* element, int id, paint_t* paint)
{
    const string_t* value = find_attribute(element, id, true);
    if(value == NULL)
        return false;
    const char* it = value->data;
    const char* end = it + value->length;
    if(skip_string(&it, end, "none")) {
        paint->type = paint_type_none;
        return !skip_ws(&it, end);
    }

    if(parse_url_value(&it, end, &paint->id)) {
        paint->type = paint_type_url;
        paint->color.value = 0x00000000;
        if(skip_ws(&it, end)) {
            if(!parse_color_value(&it, end, &paint->color)) {
                return false;
            }
        }

        return it == end;
    }

    if(skip_string(&it, end, "var")) {
        if(!skip_ws(&it, end)
            || !skip_delim(&it, end, '(')
            || !skip_ws(&it, end)) {
            return false;
        }

        if(!skip_string(&it, end, "--"))
            return false;
        const char* begin = it;
        while(it < end && IS_NAMECHAR(*it))
            ++it;
        paint->type = paint_type_var;
        paint->id.data = begin;
        paint->id.length = it - begin;
        paint->color.value = 0x00000000;
        skip_ws(&it, end);
        if(skip_delim(&it, end, ',')) {
            skip_ws(&it, end);
            if(!parse_color_value(&it, end, &paint->color)) {
                return false;
            }
        }

        return skip_delim(&it, end, ')') && !skip_ws(&it, end);
    }

    if(parse_color_value(&it, end, &paint->color)) {
        paint->type = paint_type_color;
        return it == end;
    }

    return false;
}